

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id.cpp
# Opt level: O0

int Id_applyLogic(int *v1,int *v2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int temp;
  int *v2_local;
  int *v1_local;
  
  iVar1 = *v2;
  if (iVar1 < 0x6d73e560) {
    iVar2 = *v1;
    iVar3 = *v2;
    *v1 = *v2;
    *v2 = iVar2 + iVar3;
  }
  v1_local._4_4_ = (uint)(iVar1 >= 0x6d73e560);
  return v1_local._4_4_;
}

Assistant:

int Id_applyLogic(int *v1, int *v2) {
    if (*v2 > 1836311903) { // 46th Fibonacci fits in int
        return 1;
    }

    int temp = *v1 + *v2;
    *v1 = *v2;
    *v2 = temp;
    return 0;
}